

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_pack.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  ostream *poVar1;
  TestStruct a;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"sizeof(struct TestStruct) = ",0x1c);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"c1 ",3);
  poVar1 = std::ostream::_M_insert<void_const*>(&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," s ",3);
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," c2 ",4);
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," i ",3);
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
	struct TestStruct a;

	cout << "sizeof(struct TestStruct) = " << sizeof(struct TestStruct) << endl;
	cout << "c1 " << static_cast<const void *>(&a.c1)
	     << " s " << static_cast<const void *>(&a.s)
	     << " c2 "<< static_cast<const void *>(&a.c2)
	     << " i " << static_cast<const void *>(&a.i)
	     << endl;

	return 0;
}